

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall
cnn::SimpleSGDTrainer::update
          (SimpleSGDTrainer *this,
          vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *lookup_params,
          vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *params,real scale)

{
  float fVar1;
  pointer ppPVar2;
  Parameters *this_00;
  float *pfVar3;
  float *pfVar4;
  pointer ppLVar5;
  LookupParameters *this_01;
  pointer pTVar6;
  pointer pTVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  byte bVar13;
  byte bVar14;
  uint uVar15;
  Index size;
  _Hash_node_base *p_Var17;
  uint uVar18;
  Index index_1;
  char *pcVar19;
  Index index;
  ulong uVar20;
  uint uVar21;
  Index index_2;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  pointer ppPVar25;
  pointer ppLVar26;
  ushort uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar43;
  int iVar44;
  int iVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong uVar16;
  
  fVar43 = Trainer::clip_gradients(&this->super_Trainer);
  ppPVar25 = (params->super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (params->super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar25 != ppPVar2) {
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_00 = *ppPVar25;
      iVar45 = 1;
      iVar44 = 1;
      uVar16 = (ulong)(this_00->values).d.nd;
      if (uVar16 != 0) {
        auVar32 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar33 = vpbroadcastq_avx512f();
        uVar20 = 0;
        do {
          auVar34 = vpbroadcastq_avx512f();
          auVar35 = vmovdqa64_avx512f(auVar32);
          auVar32 = vporq_avx512f(auVar34,auVar30);
          auVar34 = vporq_avx512f(auVar34,auVar31);
          uVar11 = vpcmpuq_avx512f(auVar34,auVar33,2);
          bVar13 = (byte)uVar11;
          uVar11 = vpcmpuq_avx512f(auVar32,auVar33,2);
          bVar14 = (byte)uVar11;
          uVar27 = CONCAT11(bVar14,bVar13);
          auVar32 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar20));
          auVar34._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar32._4_4_;
          auVar34._0_4_ = (uint)(bVar13 & 1) * auVar32._0_4_;
          auVar34._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar32._8_4_;
          auVar34._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar32._12_4_;
          auVar34._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar32._16_4_;
          auVar34._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar32._20_4_;
          auVar34._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar32._24_4_;
          auVar34._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * auVar32._28_4_;
          auVar34._32_4_ = (uint)(bVar14 & 1) * auVar32._32_4_;
          auVar34._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar32._36_4_;
          auVar34._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar32._40_4_;
          auVar34._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar32._44_4_;
          auVar34._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar32._48_4_;
          auVar34._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar32._52_4_;
          auVar34._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar32._56_4_;
          auVar34._60_4_ = (uint)(bVar14 >> 7) * auVar32._60_4_;
          uVar20 = uVar20 + 0x10;
          auVar32 = vpmulld_avx512f(auVar34,auVar35);
        } while ((uVar16 + 0xf & 0x1fffffff0) != uVar20);
        auVar32 = vmovdqa32_avx512f(auVar32);
        auVar33._0_4_ =
             (uint)(bVar13 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar35._0_4_;
        bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
        auVar33._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar35._4_4_;
        bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
        auVar33._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar35._8_4_;
        bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
        auVar33._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar35._12_4_;
        bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
        auVar33._16_4_ = (uint)bVar8 * auVar32._16_4_ | (uint)!bVar8 * auVar35._16_4_;
        bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
        auVar33._20_4_ = (uint)bVar8 * auVar32._20_4_ | (uint)!bVar8 * auVar35._20_4_;
        bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
        auVar33._24_4_ = (uint)bVar8 * auVar32._24_4_ | (uint)!bVar8 * auVar35._24_4_;
        bVar8 = (bool)((byte)(uVar27 >> 7) & 1);
        auVar33._28_4_ = (uint)bVar8 * auVar32._28_4_ | (uint)!bVar8 * auVar35._28_4_;
        auVar33._32_4_ =
             (uint)(bVar14 & 1) * auVar32._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar35._32_4_;
        bVar8 = (bool)(bVar14 >> 1 & 1);
        auVar33._36_4_ = (uint)bVar8 * auVar32._36_4_ | (uint)!bVar8 * auVar35._36_4_;
        bVar8 = (bool)(bVar14 >> 2 & 1);
        auVar33._40_4_ = (uint)bVar8 * auVar32._40_4_ | (uint)!bVar8 * auVar35._40_4_;
        bVar8 = (bool)(bVar14 >> 3 & 1);
        auVar33._44_4_ = (uint)bVar8 * auVar32._44_4_ | (uint)!bVar8 * auVar35._44_4_;
        bVar8 = (bool)(bVar14 >> 4 & 1);
        auVar33._48_4_ = (uint)bVar8 * auVar32._48_4_ | (uint)!bVar8 * auVar35._48_4_;
        bVar8 = (bool)(bVar14 >> 5 & 1);
        auVar33._52_4_ = (uint)bVar8 * auVar32._52_4_ | (uint)!bVar8 * auVar35._52_4_;
        bVar8 = (bool)(bVar14 >> 6 & 1);
        auVar33._56_4_ = (uint)bVar8 * auVar32._56_4_ | (uint)!bVar8 * auVar35._56_4_;
        auVar33._60_4_ =
             (uint)(bVar14 >> 7) * auVar32._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar35._60_4_;
        auVar29 = vextracti64x4_avx512f(auVar33,1);
        auVar32 = vpmulld_avx512f(auVar33,ZEXT3264(auVar29));
        auVar28 = vpmulld_avx(auVar32._0_16_,auVar32._16_16_);
        auVar10 = vpshufd_avx(auVar28,0xee);
        auVar28 = vpmulld_avx(auVar28,auVar10);
        auVar10 = vpshufd_avx(auVar28,0x55);
        auVar28 = vpmulld_avx(auVar28,auVar10);
        iVar44 = auVar28._0_4_;
      }
      uVar20 = (ulong)(this_00->g).d.nd;
      if (uVar20 != 0) {
        auVar32 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar33 = vpbroadcastq_avx512f();
        uVar22 = 0;
        do {
          auVar34 = vpbroadcastq_avx512f();
          auVar35 = vmovdqa64_avx512f(auVar32);
          auVar32 = vporq_avx512f(auVar34,auVar30);
          auVar34 = vporq_avx512f(auVar34,auVar31);
          uVar11 = vpcmpuq_avx512f(auVar34,auVar33,2);
          bVar13 = (byte)uVar11;
          uVar11 = vpcmpuq_avx512f(auVar32,auVar33,2);
          bVar14 = (byte)uVar11;
          uVar27 = CONCAT11(bVar14,bVar13);
          auVar32 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar22));
          auVar37._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar32._4_4_;
          auVar37._0_4_ = (uint)(bVar13 & 1) * auVar32._0_4_;
          auVar37._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar32._8_4_;
          auVar37._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar32._12_4_;
          auVar37._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar32._16_4_;
          auVar37._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar32._20_4_;
          auVar37._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar32._24_4_;
          auVar37._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * auVar32._28_4_;
          auVar37._32_4_ = (uint)(bVar14 & 1) * auVar32._32_4_;
          auVar37._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar32._36_4_;
          auVar37._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar32._40_4_;
          auVar37._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar32._44_4_;
          auVar37._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar32._48_4_;
          auVar37._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar32._52_4_;
          auVar37._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar32._56_4_;
          auVar37._60_4_ = (uint)(bVar14 >> 7) * auVar32._60_4_;
          uVar22 = uVar22 + 0x10;
          auVar32 = vpmulld_avx512f(auVar37,auVar35);
        } while ((uVar20 + 0xf & 0x1fffffff0) != uVar22);
        auVar32 = vmovdqa32_avx512f(auVar32);
        auVar36._0_4_ =
             (uint)(bVar13 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar35._0_4_;
        bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar35._4_4_;
        bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar35._8_4_;
        bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar35._12_4_;
        bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar8 * auVar32._16_4_ | (uint)!bVar8 * auVar35._16_4_;
        bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar8 * auVar32._20_4_ | (uint)!bVar8 * auVar35._20_4_;
        bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar8 * auVar32._24_4_ | (uint)!bVar8 * auVar35._24_4_;
        bVar8 = (bool)((byte)(uVar27 >> 7) & 1);
        auVar36._28_4_ = (uint)bVar8 * auVar32._28_4_ | (uint)!bVar8 * auVar35._28_4_;
        auVar36._32_4_ =
             (uint)(bVar14 & 1) * auVar32._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar35._32_4_;
        bVar8 = (bool)(bVar14 >> 1 & 1);
        auVar36._36_4_ = (uint)bVar8 * auVar32._36_4_ | (uint)!bVar8 * auVar35._36_4_;
        bVar8 = (bool)(bVar14 >> 2 & 1);
        auVar36._40_4_ = (uint)bVar8 * auVar32._40_4_ | (uint)!bVar8 * auVar35._40_4_;
        bVar8 = (bool)(bVar14 >> 3 & 1);
        auVar36._44_4_ = (uint)bVar8 * auVar32._44_4_ | (uint)!bVar8 * auVar35._44_4_;
        bVar8 = (bool)(bVar14 >> 4 & 1);
        auVar36._48_4_ = (uint)bVar8 * auVar32._48_4_ | (uint)!bVar8 * auVar35._48_4_;
        bVar8 = (bool)(bVar14 >> 5 & 1);
        auVar36._52_4_ = (uint)bVar8 * auVar32._52_4_ | (uint)!bVar8 * auVar35._52_4_;
        bVar8 = (bool)(bVar14 >> 6 & 1);
        auVar36._56_4_ = (uint)bVar8 * auVar32._56_4_ | (uint)!bVar8 * auVar35._56_4_;
        auVar36._60_4_ =
             (uint)(bVar14 >> 7) * auVar32._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar35._60_4_;
        auVar29 = vextracti64x4_avx512f(auVar36,1);
        auVar32 = vpmulld_avx512f(auVar36,ZEXT3264(auVar29));
        auVar28 = vpmulld_avx(auVar32._0_16_,auVar32._16_16_);
        auVar10 = vpshufd_avx(auVar28,0xee);
        auVar28 = vpmulld_avx(auVar28,auVar10);
        auVar10 = vpshufd_avx(auVar28,0x55);
        auVar28 = vpmulld_avx(auVar28,auVar10);
        iVar45 = auVar28._0_4_;
      }
      uVar15 = (this_00->values).d.bd;
      uVar18 = iVar44 * uVar15;
      if (iVar45 * (this_00->g).d.bd != uVar18) {
        pcVar19 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
        ;
LAB_00227a43:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar19);
      }
      if (uVar16 == 0) {
        iVar44 = 1;
      }
      else {
        auVar32 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar33 = vpbroadcastq_avx512f();
        uVar20 = 0;
        do {
          auVar34 = vpbroadcastq_avx512f();
          auVar35 = vmovdqa64_avx512f(auVar32);
          auVar32 = vporq_avx512f(auVar34,auVar30);
          auVar34 = vporq_avx512f(auVar34,auVar31);
          uVar11 = vpcmpuq_avx512f(auVar34,auVar33,2);
          bVar13 = (byte)uVar11;
          uVar11 = vpcmpuq_avx512f(auVar32,auVar33,2);
          bVar14 = (byte)uVar11;
          uVar27 = CONCAT11(bVar14,bVar13);
          auVar34 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar20));
          auVar32._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar34._4_4_;
          auVar32._0_4_ = (uint)(bVar13 & 1) * auVar34._0_4_;
          auVar32._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar34._8_4_;
          auVar32._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar34._12_4_;
          auVar32._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar34._16_4_;
          auVar32._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar34._20_4_;
          auVar32._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar34._24_4_;
          auVar32._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * auVar34._28_4_;
          auVar32._32_4_ = (uint)(bVar14 & 1) * auVar34._32_4_;
          auVar32._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar34._36_4_;
          auVar32._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar34._40_4_;
          auVar32._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar34._44_4_;
          auVar32._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar34._48_4_;
          auVar32._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar34._52_4_;
          auVar32._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar34._56_4_;
          auVar32._60_4_ = (uint)(bVar14 >> 7) * auVar34._60_4_;
          uVar20 = uVar20 + 0x10;
          auVar32 = vpmulld_avx512f(auVar32,auVar35);
        } while ((uVar16 + 0xf & 0x1fffffff0) != uVar20);
        auVar30 = vmovdqa32_avx512f(auVar32);
        auVar31._0_4_ =
             (uint)(bVar13 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar35._0_4_;
        bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
        auVar31._4_4_ = (uint)bVar8 * auVar30._4_4_ | (uint)!bVar8 * auVar35._4_4_;
        bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
        auVar31._8_4_ = (uint)bVar8 * auVar30._8_4_ | (uint)!bVar8 * auVar35._8_4_;
        bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
        auVar31._12_4_ = (uint)bVar8 * auVar30._12_4_ | (uint)!bVar8 * auVar35._12_4_;
        bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
        auVar31._16_4_ = (uint)bVar8 * auVar30._16_4_ | (uint)!bVar8 * auVar35._16_4_;
        bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
        auVar31._20_4_ = (uint)bVar8 * auVar30._20_4_ | (uint)!bVar8 * auVar35._20_4_;
        bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
        auVar31._24_4_ = (uint)bVar8 * auVar30._24_4_ | (uint)!bVar8 * auVar35._24_4_;
        bVar8 = (bool)((byte)(uVar27 >> 7) & 1);
        auVar31._28_4_ = (uint)bVar8 * auVar30._28_4_ | (uint)!bVar8 * auVar35._28_4_;
        auVar31._32_4_ =
             (uint)(bVar14 & 1) * auVar30._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar35._32_4_;
        bVar8 = (bool)(bVar14 >> 1 & 1);
        auVar31._36_4_ = (uint)bVar8 * auVar30._36_4_ | (uint)!bVar8 * auVar35._36_4_;
        bVar8 = (bool)(bVar14 >> 2 & 1);
        auVar31._40_4_ = (uint)bVar8 * auVar30._40_4_ | (uint)!bVar8 * auVar35._40_4_;
        bVar8 = (bool)(bVar14 >> 3 & 1);
        auVar31._44_4_ = (uint)bVar8 * auVar30._44_4_ | (uint)!bVar8 * auVar35._44_4_;
        bVar8 = (bool)(bVar14 >> 4 & 1);
        auVar31._48_4_ = (uint)bVar8 * auVar30._48_4_ | (uint)!bVar8 * auVar35._48_4_;
        bVar8 = (bool)(bVar14 >> 5 & 1);
        auVar31._52_4_ = (uint)bVar8 * auVar30._52_4_ | (uint)!bVar8 * auVar35._52_4_;
        bVar8 = (bool)(bVar14 >> 6 & 1);
        auVar31._56_4_ = (uint)bVar8 * auVar30._56_4_ | (uint)!bVar8 * auVar35._56_4_;
        auVar31._60_4_ =
             (uint)(bVar14 >> 7) * auVar30._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar35._60_4_;
        auVar29 = vextracti64x4_avx512f(auVar31,1);
        auVar30 = vpmulld_avx512f(auVar31,ZEXT3264(auVar29));
        auVar28 = vpmulld_avx(auVar30._0_16_,auVar30._16_16_);
        auVar10 = vpshufd_avx(auVar28,0xee);
        auVar28 = vpmulld_avx(auVar28,auVar10);
        auVar10 = vpshufd_avx(auVar28,0x55);
        auVar28 = vpmulld_avx(auVar28,auVar10);
        iVar44 = auVar28._0_4_;
      }
      fVar1 = (this->super_Trainer).lambda;
      pfVar3 = (this_00->values).v;
      pfVar4 = (this_00->g).v;
      uVar15 = iVar44 * uVar15;
      uVar16 = (ulong)uVar15;
      fVar9 = fVar43 * scale * (this->super_Trainer).eta;
      if (uVar15 != uVar18) {
        pcVar19 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
        ;
LAB_00227a21:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar19);
      }
      uVar20 = uVar16;
      if ((((ulong)pfVar3 & 3) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 0xf), uVar16 <= uVar20)) {
        uVar20 = uVar16;
      }
      uVar23 = uVar16 - uVar20;
      uVar22 = uVar23 + 0xf;
      if (-1 < (long)uVar23) {
        uVar22 = uVar23;
      }
      if (uVar20 != 0) {
        auVar28._8_4_ = 0x80000000;
        auVar28._0_8_ = 0x8000000080000000;
        auVar28._12_4_ = 0x80000000;
        auVar28 = vxorps_avx512vl(ZEXT416((uint)fVar9),auVar28);
        uVar24 = 0;
        do {
          auVar10 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * pfVar3[uVar24])),auVar28,
                                    ZEXT416((uint)pfVar4[uVar24]));
          pfVar3[uVar24] = pfVar3[uVar24] + auVar10._0_4_;
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
      }
      uVar22 = (uVar22 & 0xfffffffffffffff0) + uVar20;
      if (0xf < (long)uVar23) {
        auVar10._8_4_ = 0x80000000;
        auVar10._0_8_ = 0x8000000080000000;
        auVar10._12_4_ = 0x80000000;
        auVar28 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar10);
        auVar30 = vbroadcastss_avx512f(ZEXT416((uint)fVar9));
        auVar31 = vbroadcastss_avx512f(auVar28);
        do {
          auVar32 = vfmsub213ps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar20),auVar30,
                                        *(undefined1 (*) [64])(pfVar3 + uVar20));
          auVar32 = vfmsub231ps_avx512f(auVar32,auVar31,*(undefined1 (*) [64])(pfVar3 + uVar20));
          *(undefined1 (*) [64])(pfVar3 + uVar20) = auVar32;
          uVar20 = uVar20 + 0x10;
        } while ((long)uVar20 < (long)uVar22);
      }
      if ((long)uVar22 < (long)uVar16) {
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar28 = vxorps_avx512vl(ZEXT416((uint)fVar9),auVar12);
        do {
          auVar10 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * pfVar3[uVar22])),auVar28,
                                    ZEXT416((uint)pfVar4[uVar22]));
          pfVar3[uVar22] = pfVar3[uVar22] + auVar10._0_4_;
          uVar22 = uVar22 + 1;
        } while (uVar16 != uVar22);
      }
      Parameters::clear(this_00);
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      ppPVar25 = ppPVar25 + 1;
    } while (ppPVar25 != ppPVar2);
  }
  ppLVar26 = (lookup_params->
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar5 = (lookup_params->
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar26 != ppLVar5) {
    auVar30 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_01 = *ppLVar26;
      for (p_Var17 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        uVar15 = *(uint *)&p_Var17[1]._M_nxt;
        pTVar6 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar45 = 1;
        iVar44 = 1;
        uVar16 = (ulong)pTVar6[uVar15].d.nd;
        if (uVar16 != 0) {
          auVar33 = vmovdqa64_avx512f(auVar30);
          auVar34 = vpbroadcastq_avx512f();
          uVar20 = 0;
          do {
            auVar35 = vpbroadcastq_avx512f();
            auVar37 = vmovdqa64_avx512f(auVar33);
            auVar33 = vporq_avx512f(auVar35,auVar31);
            auVar35 = vporq_avx512f(auVar35,auVar32);
            uVar11 = vpcmpuq_avx512f(auVar35,auVar34,2);
            bVar13 = (byte)uVar11;
            uVar11 = vpcmpuq_avx512f(auVar33,auVar34,2);
            bVar14 = (byte)uVar11;
            uVar27 = CONCAT11(bVar14,bVar13);
            auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar6[uVar15].d.d + uVar20));
            auVar35._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar33._4_4_;
            auVar35._0_4_ = (uint)(bVar13 & 1) * auVar33._0_4_;
            auVar35._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar33._8_4_;
            auVar35._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar33._12_4_;
            auVar35._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar33._16_4_;
            auVar35._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar33._20_4_;
            auVar35._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar33._24_4_;
            auVar35._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * auVar33._28_4_;
            auVar35._32_4_ = (uint)(bVar14 & 1) * auVar33._32_4_;
            auVar35._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar33._36_4_;
            auVar35._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar33._40_4_;
            auVar35._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar33._44_4_;
            auVar35._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar33._48_4_;
            auVar35._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar33._52_4_;
            auVar35._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar33._56_4_;
            auVar35._60_4_ = (uint)(bVar14 >> 7) * auVar33._60_4_;
            uVar20 = uVar20 + 0x10;
            auVar33 = vpmulld_avx512f(auVar35,auVar37);
          } while ((uVar16 + 0xf & 0x1fffffff0) != uVar20);
          auVar33 = vmovdqa32_avx512f(auVar33);
          auVar38._0_4_ =
               (uint)(bVar13 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar37._0_4_;
          bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
          auVar38._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar37._4_4_;
          bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
          auVar38._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar37._8_4_;
          bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
          auVar38._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar37._12_4_;
          bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
          auVar38._16_4_ = (uint)bVar8 * auVar33._16_4_ | (uint)!bVar8 * auVar37._16_4_;
          bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
          auVar38._20_4_ = (uint)bVar8 * auVar33._20_4_ | (uint)!bVar8 * auVar37._20_4_;
          bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
          auVar38._24_4_ = (uint)bVar8 * auVar33._24_4_ | (uint)!bVar8 * auVar37._24_4_;
          bVar8 = (bool)((byte)(uVar27 >> 7) & 1);
          auVar38._28_4_ = (uint)bVar8 * auVar33._28_4_ | (uint)!bVar8 * auVar37._28_4_;
          auVar38._32_4_ =
               (uint)(bVar14 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar37._32_4_;
          bVar8 = (bool)(bVar14 >> 1 & 1);
          auVar38._36_4_ = (uint)bVar8 * auVar33._36_4_ | (uint)!bVar8 * auVar37._36_4_;
          bVar8 = (bool)(bVar14 >> 2 & 1);
          auVar38._40_4_ = (uint)bVar8 * auVar33._40_4_ | (uint)!bVar8 * auVar37._40_4_;
          bVar8 = (bool)(bVar14 >> 3 & 1);
          auVar38._44_4_ = (uint)bVar8 * auVar33._44_4_ | (uint)!bVar8 * auVar37._44_4_;
          bVar8 = (bool)(bVar14 >> 4 & 1);
          auVar38._48_4_ = (uint)bVar8 * auVar33._48_4_ | (uint)!bVar8 * auVar37._48_4_;
          bVar8 = (bool)(bVar14 >> 5 & 1);
          auVar38._52_4_ = (uint)bVar8 * auVar33._52_4_ | (uint)!bVar8 * auVar37._52_4_;
          bVar8 = (bool)(bVar14 >> 6 & 1);
          auVar38._56_4_ = (uint)bVar8 * auVar33._56_4_ | (uint)!bVar8 * auVar37._56_4_;
          auVar38._60_4_ =
               (uint)(bVar14 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar37._60_4_;
          auVar29 = vextracti64x4_avx512f(auVar38,1);
          auVar33 = vpmulld_avx512f(auVar38,ZEXT3264(auVar29));
          auVar28 = vpmulld_avx(auVar33._0_16_,auVar33._16_16_);
          auVar10 = vpshufd_avx(auVar28,0xee);
          auVar28 = vpmulld_avx(auVar28,auVar10);
          auVar10 = vpshufd_avx(auVar28,0x55);
          auVar28 = vpmulld_avx(auVar28,auVar10);
          iVar44 = auVar28._0_4_;
        }
        pTVar7 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar20 = (ulong)pTVar7[uVar15].d.nd;
        if (uVar20 != 0) {
          auVar33 = vmovdqa64_avx512f(auVar30);
          auVar34 = vpbroadcastq_avx512f();
          uVar22 = 0;
          do {
            auVar35 = vpbroadcastq_avx512f();
            auVar37 = vmovdqa64_avx512f(auVar33);
            auVar33 = vporq_avx512f(auVar35,auVar31);
            auVar35 = vporq_avx512f(auVar35,auVar32);
            uVar11 = vpcmpuq_avx512f(auVar35,auVar34,2);
            bVar13 = (byte)uVar11;
            uVar11 = vpcmpuq_avx512f(auVar33,auVar34,2);
            bVar14 = (byte)uVar11;
            uVar27 = CONCAT11(bVar14,bVar13);
            auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar7[uVar15].d.d + uVar22));
            auVar39._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar33._4_4_;
            auVar39._0_4_ = (uint)(bVar13 & 1) * auVar33._0_4_;
            auVar39._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar33._8_4_;
            auVar39._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar33._12_4_;
            auVar39._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar33._16_4_;
            auVar39._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar33._20_4_;
            auVar39._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar33._24_4_;
            auVar39._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * auVar33._28_4_;
            auVar39._32_4_ = (uint)(bVar14 & 1) * auVar33._32_4_;
            auVar39._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar33._36_4_;
            auVar39._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar33._40_4_;
            auVar39._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar33._44_4_;
            auVar39._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar33._48_4_;
            auVar39._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar33._52_4_;
            auVar39._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar33._56_4_;
            auVar39._60_4_ = (uint)(bVar14 >> 7) * auVar33._60_4_;
            uVar22 = uVar22 + 0x10;
            auVar33 = vpmulld_avx512f(auVar39,auVar37);
          } while ((uVar20 + 0xf & 0x1fffffff0) != uVar22);
          auVar33 = vmovdqa32_avx512f(auVar33);
          auVar40._0_4_ =
               (uint)(bVar13 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar37._0_4_;
          bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
          auVar40._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar37._4_4_;
          bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
          auVar40._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar37._8_4_;
          bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
          auVar40._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar37._12_4_;
          bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
          auVar40._16_4_ = (uint)bVar8 * auVar33._16_4_ | (uint)!bVar8 * auVar37._16_4_;
          bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
          auVar40._20_4_ = (uint)bVar8 * auVar33._20_4_ | (uint)!bVar8 * auVar37._20_4_;
          bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
          auVar40._24_4_ = (uint)bVar8 * auVar33._24_4_ | (uint)!bVar8 * auVar37._24_4_;
          bVar8 = (bool)((byte)(uVar27 >> 7) & 1);
          auVar40._28_4_ = (uint)bVar8 * auVar33._28_4_ | (uint)!bVar8 * auVar37._28_4_;
          auVar40._32_4_ =
               (uint)(bVar14 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar37._32_4_;
          bVar8 = (bool)(bVar14 >> 1 & 1);
          auVar40._36_4_ = (uint)bVar8 * auVar33._36_4_ | (uint)!bVar8 * auVar37._36_4_;
          bVar8 = (bool)(bVar14 >> 2 & 1);
          auVar40._40_4_ = (uint)bVar8 * auVar33._40_4_ | (uint)!bVar8 * auVar37._40_4_;
          bVar8 = (bool)(bVar14 >> 3 & 1);
          auVar40._44_4_ = (uint)bVar8 * auVar33._44_4_ | (uint)!bVar8 * auVar37._44_4_;
          bVar8 = (bool)(bVar14 >> 4 & 1);
          auVar40._48_4_ = (uint)bVar8 * auVar33._48_4_ | (uint)!bVar8 * auVar37._48_4_;
          bVar8 = (bool)(bVar14 >> 5 & 1);
          auVar40._52_4_ = (uint)bVar8 * auVar33._52_4_ | (uint)!bVar8 * auVar37._52_4_;
          bVar8 = (bool)(bVar14 >> 6 & 1);
          auVar40._56_4_ = (uint)bVar8 * auVar33._56_4_ | (uint)!bVar8 * auVar37._56_4_;
          auVar40._60_4_ =
               (uint)(bVar14 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar37._60_4_;
          auVar29 = vextracti64x4_avx512f(auVar40,1);
          auVar33 = vpmulld_avx512f(auVar40,ZEXT3264(auVar29));
          auVar28 = vpmulld_avx(auVar33._0_16_,auVar33._16_16_);
          auVar10 = vpshufd_avx(auVar28,0xee);
          auVar28 = vpmulld_avx(auVar28,auVar10);
          auVar10 = vpshufd_avx(auVar28,0x55);
          auVar28 = vpmulld_avx(auVar28,auVar10);
          iVar45 = auVar28._0_4_;
        }
        uVar18 = pTVar6[uVar15].d.bd;
        uVar21 = iVar44 * uVar18;
        if (iVar45 * pTVar7[uVar15].d.bd != uVar21) {
          pcVar19 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
          ;
          goto LAB_00227a43;
        }
        if (uVar16 == 0) {
          iVar44 = 1;
        }
        else {
          auVar33 = vmovdqa64_avx512f(auVar30);
          auVar34 = vpbroadcastq_avx512f();
          uVar20 = 0;
          do {
            auVar35 = vpbroadcastq_avx512f();
            auVar37 = vmovdqa64_avx512f(auVar33);
            auVar33 = vporq_avx512f(auVar35,auVar31);
            auVar35 = vporq_avx512f(auVar35,auVar32);
            uVar11 = vpcmpuq_avx512f(auVar35,auVar34,2);
            bVar13 = (byte)uVar11;
            uVar11 = vpcmpuq_avx512f(auVar33,auVar34,2);
            bVar14 = (byte)uVar11;
            uVar27 = CONCAT11(bVar14,bVar13);
            auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar6[uVar15].d.d + uVar20));
            auVar41._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar33._4_4_;
            auVar41._0_4_ = (uint)(bVar13 & 1) * auVar33._0_4_;
            auVar41._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar33._8_4_;
            auVar41._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar33._12_4_;
            auVar41._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar33._16_4_;
            auVar41._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar33._20_4_;
            auVar41._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar33._24_4_;
            auVar41._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * auVar33._28_4_;
            auVar41._32_4_ = (uint)(bVar14 & 1) * auVar33._32_4_;
            auVar41._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar33._36_4_;
            auVar41._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar33._40_4_;
            auVar41._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar33._44_4_;
            auVar41._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar33._48_4_;
            auVar41._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar33._52_4_;
            auVar41._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar33._56_4_;
            auVar41._60_4_ = (uint)(bVar14 >> 7) * auVar33._60_4_;
            uVar20 = uVar20 + 0x10;
            auVar33 = vpmulld_avx512f(auVar41,auVar37);
          } while ((uVar16 + 0xf & 0x1fffffff0) != uVar20);
          auVar33 = vmovdqa32_avx512f(auVar33);
          auVar42._0_4_ =
               (uint)(bVar13 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar37._0_4_;
          bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
          auVar42._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar37._4_4_;
          bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
          auVar42._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar37._8_4_;
          bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
          auVar42._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar37._12_4_;
          bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
          auVar42._16_4_ = (uint)bVar8 * auVar33._16_4_ | (uint)!bVar8 * auVar37._16_4_;
          bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
          auVar42._20_4_ = (uint)bVar8 * auVar33._20_4_ | (uint)!bVar8 * auVar37._20_4_;
          bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
          auVar42._24_4_ = (uint)bVar8 * auVar33._24_4_ | (uint)!bVar8 * auVar37._24_4_;
          bVar8 = (bool)((byte)(uVar27 >> 7) & 1);
          auVar42._28_4_ = (uint)bVar8 * auVar33._28_4_ | (uint)!bVar8 * auVar37._28_4_;
          auVar42._32_4_ =
               (uint)(bVar14 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar37._32_4_;
          bVar8 = (bool)(bVar14 >> 1 & 1);
          auVar42._36_4_ = (uint)bVar8 * auVar33._36_4_ | (uint)!bVar8 * auVar37._36_4_;
          bVar8 = (bool)(bVar14 >> 2 & 1);
          auVar42._40_4_ = (uint)bVar8 * auVar33._40_4_ | (uint)!bVar8 * auVar37._40_4_;
          bVar8 = (bool)(bVar14 >> 3 & 1);
          auVar42._44_4_ = (uint)bVar8 * auVar33._44_4_ | (uint)!bVar8 * auVar37._44_4_;
          bVar8 = (bool)(bVar14 >> 4 & 1);
          auVar42._48_4_ = (uint)bVar8 * auVar33._48_4_ | (uint)!bVar8 * auVar37._48_4_;
          bVar8 = (bool)(bVar14 >> 5 & 1);
          auVar42._52_4_ = (uint)bVar8 * auVar33._52_4_ | (uint)!bVar8 * auVar37._52_4_;
          bVar8 = (bool)(bVar14 >> 6 & 1);
          auVar42._56_4_ = (uint)bVar8 * auVar33._56_4_ | (uint)!bVar8 * auVar37._56_4_;
          auVar42._60_4_ =
               (uint)(bVar14 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar37._60_4_;
          auVar29 = vextracti64x4_avx512f(auVar42,1);
          auVar33 = vpmulld_avx512f(auVar42,ZEXT3264(auVar29));
          auVar28 = vpmulld_avx(auVar33._0_16_,auVar33._16_16_);
          auVar10 = vpshufd_avx(auVar28,0xee);
          auVar28 = vpmulld_avx(auVar28,auVar10);
          auVar10 = vpshufd_avx(auVar28,0x55);
          auVar28 = vpmulld_avx(auVar28,auVar10);
          iVar44 = auVar28._0_4_;
        }
        uVar18 = iVar44 * uVar18;
        uVar16 = (ulong)uVar18;
        if (uVar18 != uVar21) {
          pcVar19 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
          ;
          goto LAB_00227a21;
        }
        pfVar3 = pTVar6[uVar15].v;
        uVar20 = uVar16;
        if ((((ulong)pfVar3 & 3) == 0) &&
           (uVar20 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 0xf), uVar16 <= uVar20)) {
          uVar20 = uVar16;
        }
        fVar9 = fVar43 * scale * (this->super_Trainer).eta;
        fVar1 = (this->super_Trainer).lambda;
        pfVar4 = pTVar7[uVar15].v;
        uVar23 = uVar16 - uVar20;
        uVar22 = uVar23 + 0xf;
        if (-1 < (long)uVar23) {
          uVar22 = uVar23;
        }
        if (uVar20 != 0) {
          auVar47._0_4_ = -fVar9;
          auVar47._4_4_ = 0x80000000;
          auVar47._8_4_ = 0x80000000;
          auVar47._12_4_ = 0x80000000;
          uVar24 = 0;
          do {
            auVar28 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * pfVar3[uVar24])),auVar47,
                                      ZEXT416((uint)pfVar4[uVar24]));
            pfVar3[uVar24] = pfVar3[uVar24] + auVar28._0_4_;
            uVar24 = uVar24 + 1;
          } while (uVar20 != uVar24);
        }
        uVar22 = (uVar22 & 0xfffffffffffffff0) + uVar20;
        if (0xf < (long)uVar23) {
          auVar48._0_4_ = -fVar1;
          auVar48._4_4_ = 0x80000000;
          auVar48._8_4_ = 0x80000000;
          auVar48._12_4_ = 0x80000000;
          auVar33 = vbroadcastss_avx512f(ZEXT416((uint)fVar9));
          auVar34 = vbroadcastss_avx512f(auVar48);
          do {
            auVar35 = vfmsub213ps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar20),auVar33,
                                          *(undefined1 (*) [64])(pfVar3 + uVar20));
            auVar35 = vfmsub231ps_avx512f(auVar35,auVar34,*(undefined1 (*) [64])(pfVar3 + uVar20));
            *(undefined1 (*) [64])(pfVar3 + uVar20) = auVar35;
            uVar20 = uVar20 + 0x10;
          } while ((long)uVar20 < (long)uVar22);
        }
        if ((long)uVar22 < (long)uVar16) {
          auVar46._0_4_ = -fVar9;
          auVar46._4_4_ = 0x80000000;
          auVar46._8_4_ = 0x80000000;
          auVar46._12_4_ = 0x80000000;
          do {
            auVar28 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * pfVar3[uVar22])),auVar46,
                                      ZEXT416((uint)pfVar4[uVar22]));
            pfVar3[uVar22] = pfVar3[uVar22] + auVar28._0_4_;
            uVar22 = uVar22 + 1;
          } while (uVar16 != uVar22);
        }
      }
      LookupParameters::clear(this_01);
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar30 = vpbroadcastd_avx512f(ZEXT416(1));
      ppLVar26 = ppLVar26 + 1;
    } while (ppLVar26 != ppLVar5);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void SimpleSGDTrainer::update(const std::vector<LookupParameters*> &lookup_params, const std::vector<Parameters*> &params, real scale) {
  const float gscale = clip_gradients();
  for (auto p : params) {
#if HAVE_CUDA
    gpu::sgd_update(p->values.d.size(), p->g.v, p->values.v, eta * scale * gscale, lambda);
#else
    auto reg = (p->values.vec()) * lambda;
    p->values.vec() -= ((eta * scale * gscale) * p->g.vec() + reg);
#endif
    p->clear();
  }
  for (auto p : lookup_params) {
    for (auto i : p->non_zero_grads) {
#if HAVE_CUDA
      gpu::sgd_update(p->values[i].d.size(), p->grads[i].v, p->values[i].v, eta * scale * gscale, lambda);
#else
      auto reg = (p->values[i].vec()) * lambda;
      p->values[i].vec() -= (p->grads[i].vec() * (eta * scale * gscale) + reg);
#endif
    }
    p->clear();
  }
  ++updates;
}